

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<bool> * __thiscall
VW::config::typed_option<bool>::value(typed_option<bool> *this,bool value)

{
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<bool,bool&>((bool *)&local_20);
  std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }